

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O3

void __thiscall
cmCMakePresetsGraph::PackagePreset::PackagePreset(PackagePreset *this,PackagePreset *param_1)

{
  pointer pcVar1;
  optional<bool> oVar2;
  
  Preset::Preset(&this->super_Preset,&param_1->super_Preset);
  (this->super_Preset)._vptr_Preset = (_func_int **)&PTR__PackagePreset_00a3dd28;
  (this->ConfigurePreset)._M_dataplus._M_p = (pointer)&(this->ConfigurePreset).field_2;
  pcVar1 = (param_1->ConfigurePreset)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ConfigurePreset,pcVar1,
             pcVar1 + (param_1->ConfigurePreset)._M_string_length);
  (this->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> =
       (param_1->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
       super__Optional_payload_base<bool>;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Generators,&param_1->Generators);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Configurations,&param_1->Configurations);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&(this->Variables)._M_t,&(param_1->Variables)._M_t);
  (this->ConfigFile)._M_dataplus._M_p = (pointer)&(this->ConfigFile).field_2;
  pcVar1 = (param_1->ConfigFile)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ConfigFile,pcVar1,pcVar1 + (param_1->ConfigFile)._M_string_length);
  oVar2.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->VerboseOutput).super__Optional_base<bool,_true,_true>;
  this->DebugOutput =
       (_Optional_base<bool,_true,_true>)
       (param_1->DebugOutput).super__Optional_base<bool,_true,_true>;
  this->VerboseOutput =
       (optional<bool>)
       oVar2.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  (this->PackageName)._M_dataplus._M_p = (pointer)&(this->PackageName).field_2;
  pcVar1 = (param_1->PackageName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->PackageName,pcVar1,pcVar1 + (param_1->PackageName)._M_string_length);
  (this->PackageVersion)._M_dataplus._M_p = (pointer)&(this->PackageVersion).field_2;
  pcVar1 = (param_1->PackageVersion)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->PackageVersion,pcVar1,
             pcVar1 + (param_1->PackageVersion)._M_string_length);
  (this->PackageDirectory)._M_dataplus._M_p = (pointer)&(this->PackageDirectory).field_2;
  pcVar1 = (param_1->PackageDirectory)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->PackageDirectory,pcVar1,
             pcVar1 + (param_1->PackageDirectory)._M_string_length);
  (this->VendorName)._M_dataplus._M_p = (pointer)&(this->VendorName).field_2;
  pcVar1 = (param_1->VendorName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->VendorName,pcVar1,pcVar1 + (param_1->VendorName)._M_string_length);
  return;
}

Assistant:

PackagePreset(const PackagePreset& /*other*/) = default;